

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca.cpp
# Opt level: O2

void initLCA(int root,int n)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  uVar3 = (ulong)(uint)n;
  pred[root][0] = -1;
  d[root] = 0;
  dfs(root);
  if (n < 1) {
    uVar3 = 0;
  }
  lVar2 = 0x210ac4;
  for (lVar1 = 1; lVar1 != 0x14; lVar1 = lVar1 + 1) {
    for (lVar4 = 0; uVar3 * 0x50 - lVar4 != 0; lVar4 = lVar4 + 0x50) {
      lVar6 = (long)*(int *)(lVar2 + -4 + lVar4);
      iVar5 = -1;
      if (lVar6 != -1) {
        iVar5 = pred[lVar6 + -1][lVar1 + 0x13];
      }
      *(int *)(lVar2 + lVar4) = iVar5;
    }
    lVar2 = lVar2 + 4;
  }
  return;
}

Assistant:

void initLCA(int root, int n = N) {
    pred[root][0] = -1, d[root] = 0;
    dfs(root);
    rep(l, 1, LOG) rep(i, 0, n) {
        if (pred[i][l - 1] == -1) pred[i][l] = -1;
        else pred[i][l] = pred[pred[i][l - 1]][l - 1];
    }
}